

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::deleteMaterialRenders(CNullDriver *this)

{
  pointer pSVar1;
  long *plVar2;
  u32 i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0x20;
  for (uVar3 = 0;
      pSVar1 = (this->MaterialRenderers).m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (((long)(this->MaterialRenderers).m_data.
                      super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28 &
              0xffffffffU); uVar3 = uVar3 + 1) {
    plVar2 = *(long **)((long)&(pSVar1->Name).str + lVar4);
    if (plVar2 != (long *)0x0) {
      IReferenceCounted::drop((IReferenceCounted *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    }
    lVar4 = lVar4 + 0x28;
  }
  core::array<irr::video::CNullDriver::SMaterialRenderer>::clear(&this->MaterialRenderers);
  return;
}

Assistant:

void CNullDriver::deleteMaterialRenders()
{
	// delete material renderers
	for (u32 i = 0; i < MaterialRenderers.size(); ++i)
		if (MaterialRenderers[i].Renderer)
			MaterialRenderers[i].Renderer->drop();

	MaterialRenderers.clear();
}